

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall
Jinx::Allocator<std::_Rb_tree_node<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>::deallocate
          (Allocator<std::_Rb_tree_node<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_> *this,
          void *ptr,size_t n)

{
  size_t n_local;
  void *ptr_local;
  Allocator<std::_Rb_tree_node<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_> *this_local;
  
  MemFree(ptr,n * 0x70);
  return;
}

Assistant:

void deallocate(void* ptr, size_t n) { Jinx::MemFree(static_cast<T*> (ptr), n * sizeof(value_type)); }